

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O0

void __thiscall
cxxopts::values::abstract_value<bool>::parse(abstract_value<bool> *this,string *text)

{
  string *text_local;
  abstract_value<bool> *this_local;
  
  parse_value(text,this->m_store);
  return;
}

Assistant:

void
      parse(const std::string& text) const override
      {
        parse_value(text, *m_store);
      }